

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptStackWalker.cpp
# Opt level: O0

BOOL __thiscall Js::JavascriptStackWalker::IsCallerGlobalFunction(JavascriptStackWalker *this)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  CallInfo callInfo_00;
  JavascriptFunction *this_00;
  FunctionInfo *this_01;
  ParseableFunctionInfo *this_02;
  undefined4 *puVar4;
  bool local_4a;
  bool local_49;
  FunctionInfo *funcInfo;
  JavascriptFunction *function;
  CallInfo callInfo;
  JavascriptStackWalker *this_local;
  
  callInfo_00 = GetCallInfo(this,true);
  this_00 = GetCurrentFunction(this,true);
  bVar2 = IsLibraryStackFrameEnabled(this->scriptContext);
  if ((bVar2) && (BVar3 = JavascriptFunction::IsScriptFunction(this_00), BVar3 == 0)) {
    this_local._4_4_ = 0;
  }
  else {
    this_01 = JavascriptFunction::GetFunctionInfo(this_00);
    BVar3 = FunctionInfo::HasParseableInfo(this_01);
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptStackWalker.cpp"
                                  ,0xf8,"(0)",
                                  "Here we should only have script functions which were already parsed/deserialized."
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
      local_4a = true;
      if (((ulong)callInfo_00 & 0xffffff) != 0) {
        BVar3 = IsEval(callInfo_00);
        local_4a = BVar3 != 0;
      }
      this_local._4_4_ = (uint)local_4a;
    }
    else {
      this_02 = FunctionInfo::GetParseableFunctionInfo(this_01);
      bVar2 = ParseableFunctionInfo::GetIsGlobalFunc(this_02);
      local_49 = true;
      if (!bVar2) {
        BVar3 = IsEval(callInfo_00);
        local_49 = BVar3 != 0;
      }
      this_local._4_4_ = (uint)local_49;
    }
  }
  return this_local._4_4_;
}

Assistant:

BOOL JavascriptStackWalker::IsCallerGlobalFunction() const
    {
        const CallInfo callInfo = this->GetCallInfo();

        JavascriptFunction* function = this->GetCurrentFunction();
        if (IsLibraryStackFrameEnabled(this->scriptContext) && !function->IsScriptFunction())
        {
            return false; // native library code can't be global function
        }

        FunctionInfo* funcInfo = function->GetFunctionInfo();
        if (funcInfo->HasParseableInfo())
        {
            return funcInfo->GetParseableFunctionInfo()->GetIsGlobalFunc() || IsEval(callInfo);
        }
        else
        {
            AssertMsg(FALSE, "Here we should only have script functions which were already parsed/deserialized.");
            return callInfo.Count == 0 || IsEval(callInfo);
        }
    }